

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O2

string * __thiscall
vkt::sr::(anonymous_namespace)::ShaderMatrixCase::genGLSLMatToVec3Reduction_abi_cxx11_
          (string *__return_storage_ptr__,void *this,DataType *matType,char *varName)

{
  ostream *poVar1;
  char *pcVar2;
  ostringstream op;
  ostringstream aoStack_198 [376];
  
  poVar1 = (ostream *)aoStack_198;
  std::__cxx11::ostringstream::ostringstream(aoStack_198);
  switch(*this) {
  case 1:
    poVar1 = std::operator<<((ostream *)aoStack_198,(char *)matType);
    poVar1 = std::operator<<(poVar1,", ");
    poVar1 = std::operator<<(poVar1,(char *)matType);
    poVar1 = std::operator<<(poVar1,", ");
  case 3:
    poVar1 = std::operator<<(poVar1,(char *)matType);
    pcVar2 = "";
    break;
  case 2:
    poVar1 = std::operator<<((ostream *)aoStack_198,(char *)matType);
    poVar1 = std::operator<<(poVar1,".x, ");
    poVar1 = std::operator<<(poVar1,(char *)matType);
    poVar1 = std::operator<<(poVar1,".y, ");
    poVar1 = std::operator<<(poVar1,(char *)matType);
    pcVar2 = ".x";
    break;
  case 4:
    poVar1 = std::operator<<((ostream *)aoStack_198,(char *)matType);
    poVar1 = std::operator<<(poVar1,".x, ");
    poVar1 = std::operator<<(poVar1,(char *)matType);
    poVar1 = std::operator<<(poVar1,".y, ");
    poVar1 = std::operator<<(poVar1,(char *)matType);
    poVar1 = std::operator<<(poVar1,".z+");
    poVar1 = std::operator<<(poVar1,(char *)matType);
    pcVar2 = ".w";
    break;
  case 5:
    poVar1 = std::operator<<((ostream *)aoStack_198,(char *)matType);
    poVar1 = std::operator<<(poVar1,"[0][0], ");
    poVar1 = std::operator<<(poVar1,(char *)matType);
    poVar1 = std::operator<<(poVar1,"[1][0], ");
    poVar1 = std::operator<<(poVar1,(char *)matType);
    poVar1 = std::operator<<(poVar1,"[0][1]+");
    poVar1 = std::operator<<(poVar1,(char *)matType);
    pcVar2 = "[1][1]";
    break;
  case 6:
    poVar1 = std::operator<<((ostream *)aoStack_198,(char *)matType);
    poVar1 = std::operator<<(poVar1,"[0] + ");
    poVar1 = std::operator<<(poVar1,(char *)matType);
    pcVar2 = "[1]";
    break;
  case 7:
    poVar1 = std::operator<<((ostream *)aoStack_198,(char *)matType);
    poVar1 = std::operator<<(poVar1,"[0].xyz + ");
    poVar1 = std::operator<<(poVar1,(char *)matType);
    pcVar2 = "[1].yzw";
    break;
  case 8:
    poVar1 = std::operator<<((ostream *)aoStack_198,(char *)matType);
    poVar1 = std::operator<<(poVar1,"[0][0]+");
    poVar1 = std::operator<<(poVar1,(char *)matType);
    poVar1 = std::operator<<(poVar1,"[0][1], ");
    poVar1 = std::operator<<(poVar1,(char *)matType);
    poVar1 = std::operator<<(poVar1,"[1][0]+");
    poVar1 = std::operator<<(poVar1,(char *)matType);
    pcVar2 = "[1][1], ";
    goto LAB_00598980;
  case 9:
    poVar1 = std::operator<<((ostream *)aoStack_198,(char *)matType);
    poVar1 = std::operator<<(poVar1,"[0] + ");
    poVar1 = std::operator<<(poVar1,(char *)matType);
    poVar1 = std::operator<<(poVar1,"[1] + ");
    poVar1 = std::operator<<(poVar1,(char *)matType);
    pcVar2 = "[2]";
    break;
  case 10:
    poVar1 = std::operator<<((ostream *)aoStack_198,(char *)matType);
    poVar1 = std::operator<<(poVar1,"[0].xyz + ");
    poVar1 = std::operator<<(poVar1,(char *)matType);
    poVar1 = std::operator<<(poVar1,"[1].yzw + ");
    poVar1 = std::operator<<(poVar1,(char *)matType);
    pcVar2 = "[2].zwx";
    break;
  case 0xb:
    poVar1 = std::operator<<((ostream *)aoStack_198,(char *)matType);
    poVar1 = std::operator<<(poVar1,"[0][0]+");
    poVar1 = std::operator<<(poVar1,(char *)matType);
    poVar1 = std::operator<<(poVar1,"[0][1]+");
    poVar1 = std::operator<<(poVar1,(char *)matType);
    poVar1 = std::operator<<(poVar1,"[3][0], ");
    poVar1 = std::operator<<(poVar1,(char *)matType);
    poVar1 = std::operator<<(poVar1,"[1][0]+");
    poVar1 = std::operator<<(poVar1,(char *)matType);
    poVar1 = std::operator<<(poVar1,"[1][1]+");
    poVar1 = std::operator<<(poVar1,(char *)matType);
    pcVar2 = "[3][1], ";
LAB_00598980:
    poVar1 = std::operator<<(poVar1,pcVar2);
    poVar1 = std::operator<<(poVar1,(char *)matType);
    poVar1 = std::operator<<(poVar1,"[2][0]+");
    poVar1 = std::operator<<(poVar1,(char *)matType);
    pcVar2 = "[2][1]";
    break;
  case 0xc:
    poVar1 = std::operator<<((ostream *)aoStack_198,(char *)matType);
    poVar1 = std::operator<<(poVar1,"[0] + ");
    poVar1 = std::operator<<(poVar1,(char *)matType);
    poVar1 = std::operator<<(poVar1,"[1] + ");
    poVar1 = std::operator<<(poVar1,(char *)matType);
    poVar1 = std::operator<<(poVar1,"[2] + ");
    poVar1 = std::operator<<(poVar1,(char *)matType);
    pcVar2 = "[3]";
    break;
  case 0xd:
    poVar1 = std::operator<<((ostream *)aoStack_198,(char *)matType);
    poVar1 = std::operator<<(poVar1,"[0].xyz+");
    poVar1 = std::operator<<(poVar1,(char *)matType);
    poVar1 = std::operator<<(poVar1,"[1].yzw+");
    poVar1 = std::operator<<(poVar1,(char *)matType);
    poVar1 = std::operator<<(poVar1,"[2].zwx+");
    poVar1 = std::operator<<(poVar1,(char *)matType);
    pcVar2 = "[3].wxy";
    break;
  default:
    goto switchD_005985ab_default;
  }
  std::operator<<(poVar1,pcVar2);
switchD_005985ab_default:
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(aoStack_198);
  return __return_storage_ptr__;
}

Assistant:

std::string ShaderMatrixCase::genGLSLMatToVec3Reduction (const glu::DataType& matType, const char* varName)
{
	std::ostringstream op;

	switch (matType)
	{
		case TYPE_FLOAT:		op << varName << ", "			<< varName << ", "			<< varName << "";																																			break;
		case TYPE_FLOAT_VEC2:	op << varName << ".x, "			<< varName << ".y, "		<< varName << ".x";																																			break;
		case TYPE_FLOAT_VEC3:	op << varName << "";																																																	break;
		case TYPE_FLOAT_VEC4:	op << varName << ".x, "			<< varName << ".y, "		<< varName << ".z+"			<< varName << ".w";																												break;
		case TYPE_FLOAT_MAT2:	op << varName << "[0][0], "		<< varName << "[1][0], "	<< varName << "[0][1]+"		<< varName << "[1][1]";																											break;
		case TYPE_FLOAT_MAT2X3:	op << varName << "[0] + "		<< varName << "[1]";																																									break;
		case TYPE_FLOAT_MAT2X4:	op << varName << "[0].xyz + "	<< varName << "[1].yzw";																																								break;
		case TYPE_FLOAT_MAT3X2:	op << varName << "[0][0]+"		<< varName << "[0][1], "	<< varName << "[1][0]+"		<< varName << "[1][1], "	<< varName << "[2][0]+" << varName << "[2][1]";														break;
		case TYPE_FLOAT_MAT3:	op << varName << "[0] + "		<< varName << "[1] + "		<< varName << "[2]";																																		break;
		case TYPE_FLOAT_MAT3X4:	op << varName << "[0].xyz + "	<< varName << "[1].yzw + "	<< varName << "[2].zwx";																																	break;
		case TYPE_FLOAT_MAT4X2:	op << varName << "[0][0]+"		<< varName << "[0][1]+"		<< varName << "[3][0], "	<< varName << "[1][0]+"		<< varName << "[1][1]+" << varName << "[3][1], " << varName << "[2][0]+" << varName << "[2][1]";	break;
		case TYPE_FLOAT_MAT4X3:	op << varName << "[0] + "		<< varName << "[1] + "		<< varName << "[2] + "		<< varName << "[3]";																											break;
		case TYPE_FLOAT_MAT4:	op << varName << "[0].xyz+"		<< varName << "[1].yzw+"	<< varName << "[2].zwx+"	<< varName << "[3].wxy";																										break;

		default:
			DE_ASSERT(DE_FALSE);
	}

	return op.str();
}